

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

GLenum __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::TextureTypeIrrToGL
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,E_TEXTURE_TYPE type)

{
  int in_ESI;
  double in_XMM0_Qa;
  GLenum local_4;
  
  if (in_ESI == 0) {
    local_4 = 0xde1;
  }
  else if (in_ESI == 1) {
    local_4 = 0x8513;
  }
  else {
    os::Printer::log((Printer *)"COpenGLCoreTexture::TextureTypeIrrToGL unknown texture type",
                     in_XMM0_Qa);
    local_4 = 0xde1;
  }
  return local_4;
}

Assistant:

GLenum TextureTypeIrrToGL(E_TEXTURE_TYPE type) const
	{
		switch (type) {
		case ETT_2D:
			return GL_TEXTURE_2D;
		case ETT_CUBEMAP:
			return GL_TEXTURE_CUBE_MAP;
		}

		os::Printer::log("COpenGLCoreTexture::TextureTypeIrrToGL unknown texture type", ELL_WARNING);
		return GL_TEXTURE_2D;
	}